

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase *
CreateBinaryOp(ExpressionEvalContext *ctx,SynBase *source,ExprBase *lhs,ExprBase *unevaluatedRhs,
              SynBinaryOpType op)

{
  TypeBase *pTVar1;
  Allocator *pAVar2;
  ExpressionContext *pEVar3;
  int iVar4;
  byte bVar5;
  longlong lVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ExprBase *pEVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  ulong uVar11;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  TypeBase *pTVar12;
  undefined4 extraout_var_51;
  _func_int **pp_Var13;
  uint uVar14;
  double dVar15;
  char *pcVar16;
  _func_int **pp_Var17;
  uint uVar18;
  _func_int **pp_Var19;
  bool bVar20;
  longlong rhsValue;
  double lhsValue;
  SynBase *local_38;
  
  pTVar12 = lhs->type;
  if (((pTVar12 != (TypeBase *)0x0) && (pTVar12->typeID == 0)) ||
     ((pTVar1 = unevaluatedRhs->type, pTVar1 != (TypeBase *)0x0 && (pTVar1->typeID == 0)))) {
    pcVar16 = "ERROR: encountered an error node";
    goto LAB_00143195;
  }
  if (pTVar12 != pTVar1) {
    __assert_fail("lhs->type == unevaluatedRhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,599,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  }
  bVar7 = ExpressionContext::IsIntegerType(ctx->ctx,pTVar12);
  if (((!bVar7) && ((lhs->type == (TypeBase *)0x0 || (lhs->type->typeID != 0x19)))) ||
     ((bVar7 = ExpressionContext::IsIntegerType(ctx->ctx,unevaluatedRhs->type), !bVar7 &&
      ((unevaluatedRhs->type == (TypeBase *)0x0 || (unevaluatedRhs->type->typeID != 0x19)))))) {
    pEVar10 = Evaluate(ctx,unevaluatedRhs);
    if (pEVar10 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    bVar7 = ExpressionContext::IsFloatingPointType(ctx->ctx,lhs->type);
    if ((!bVar7) || (bVar7 = ExpressionContext::IsFloatingPointType(ctx->ctx,pEVar10->type), !bVar7)
       ) {
      pTVar12 = lhs->type;
      pEVar3 = ctx->ctx;
      if ((pTVar12 == pEVar3->typeTypeID) && (pEVar10->type == pTVar12)) {
        if ((lhs->typeID == 8) && (pEVar10->typeID == 8)) {
          pp_Var13 = lhs[1]._vptr_ExprBase;
LAB_0014312e:
          pp_Var19 = pEVar10[1]._vptr_ExprBase;
LAB_00143137:
          if (op == SYN_BINARY_OP_NOT_EQUAL) {
            iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
            pEVar10 = (ExprBase *)CONCAT44(extraout_var_05,iVar8);
            pTVar12 = ctx->ctx->typeBool;
            pEVar10->next = (ExprBase *)0x0;
            bVar7 = pp_Var13 == pp_Var19;
            pEVar10->typeID = 3;
            pEVar10->source = source;
LAB_001431e5:
            pEVar10->type = pTVar12;
            pEVar10->listed = false;
            pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
            pEVar10->field_0x29 = !bVar7;
            return pEVar10;
          }
          if (op == SYN_BINARY_OP_EQUAL) {
            iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
            pEVar10 = (ExprBase *)CONCAT44(extraout_var_04,iVar8);
            pTVar12 = ctx->ctx->typeBool;
            pEVar10->next = (ExprBase *)0x0;
            bVar7 = pp_Var13 == pp_Var19;
            pEVar10->typeID = 3;
            pEVar10->source = source;
LAB_00143174:
            pEVar10->type = pTVar12;
            pEVar10->listed = false;
            pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
            pEVar10->field_0x29 = bVar7;
            return pEVar10;
          }
        }
      }
      else if ((((pTVar12 != (TypeBase *)0x0) && (pTVar12->typeID == 0x12)) &&
               (pTVar1 = pEVar10->type, pTVar1 != (TypeBase *)0x0)) && (pTVar1->typeID == 0x12)) {
        if (pTVar12 != pTVar1) {
          __assert_fail("lhs->type == rhs->type",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x371,
                        "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                       );
        }
        if (lhs->typeID == 9) {
          pp_Var13 = (_func_int **)0x0;
        }
        else {
          if (lhs->typeID != 0xc) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x37a,
                          "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                         );
          }
          pp_Var13 = lhs[1]._vptr_ExprBase;
        }
        if (pEVar10->typeID != 9) {
          if (pEVar10->typeID != 0xc) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,899,
                          "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                         );
          }
          goto LAB_0014312e;
        }
        pp_Var19 = (_func_int **)0x0;
        goto LAB_00143137;
      }
LAB_0014318e:
      pcVar16 = "ERROR: failed to eval binary op";
LAB_00143195:
      Report(ctx,pcVar16);
      return (ExprBase *)0x0;
    }
    if (lhs->type != pEVar10->type) {
      __assert_fail("lhs->type == rhs->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x33a,
                    "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                   );
    }
    lhsValue = 0.0;
    rhsValue = 0;
    bVar7 = TryTakeDouble(lhs,&lhsValue);
    if ((!bVar7) || (bVar7 = TryTakeDouble(pEVar10,(double *)&rhsValue), !bVar7)) goto LAB_0014318e;
    switch(op) {
    case SYN_BINARY_OP_ADD:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_00,iVar8);
      pTVar12 = lhs->type;
      pp_Var13 = (_func_int **)(lhsValue + (double)rhsValue);
      break;
    case SYN_BINARY_OP_SUB:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_12,iVar8);
      pTVar12 = lhs->type;
      pp_Var13 = (_func_int **)(lhsValue - (double)rhsValue);
      break;
    case SYN_BINARY_OP_MUL:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_14,iVar8);
      pTVar12 = lhs->type;
      pp_Var13 = (_func_int **)(lhsValue * (double)rhsValue);
      break;
    case SYN_BINARY_OP_DIV:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_16,iVar8);
      pTVar12 = lhs->type;
      pp_Var13 = (_func_int **)(lhsValue / (double)rhsValue);
      break;
    case SYN_BINARY_OP_MOD:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_11,iVar8);
      pTVar12 = lhs->type;
      pp_Var13 = (_func_int **)fmod(lhsValue,(double)rhsValue);
      goto LAB_00143397;
    case SYN_BINARY_OP_POW:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_13,iVar8);
      pTVar12 = lhs->type;
      pp_Var13 = (_func_int **)pow(lhsValue,(double)rhsValue);
LAB_00143397:
      pEVar10->typeID = 7;
      pEVar10->source = source;
      pEVar10->type = pTVar12;
      goto LAB_0014345e;
    default:
      __assert_fail("!\"unexpected type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x35c,
                    "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                   );
    case SYN_BINARY_OP_LESS:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_17,iVar8);
      bVar7 = (double)rhsValue == lhsValue;
      bVar20 = (double)rhsValue < lhsValue;
      goto LAB_0014349e;
    case SYN_BINARY_OP_LESS_EQUAL:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_15,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      bVar7 = (double)rhsValue < lhsValue;
      goto LAB_001433ff;
    case SYN_BINARY_OP_GREATER:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_10,iVar8);
      bVar7 = lhsValue == (double)rhsValue;
      bVar20 = lhsValue < (double)rhsValue;
LAB_0014349e:
      pTVar12 = ctx->ctx->typeBool;
      pEVar10->typeID = 3;
      pEVar10->source = source;
      pEVar10->type = pTVar12;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
      pEVar10->field_0x29 = !bVar20 && !bVar7;
      goto LAB_001430ed;
    case SYN_BINARY_OP_GREATER_EQUAL:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_08,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      bVar7 = lhsValue < (double)rhsValue;
LAB_001433ff:
      pEVar10->typeID = 3;
      pEVar10->source = source;
      pEVar10->type = pTVar12;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
      pEVar10->field_0x29 = !bVar7;
      goto LAB_001430ed;
    case SYN_BINARY_OP_EQUAL:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_09,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      bVar7 = lhsValue == (double)rhsValue;
      goto LAB_001432dd;
    case SYN_BINARY_OP_NOT_EQUAL:
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_07,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      bVar7 = lhsValue != (double)rhsValue;
LAB_001432dd:
      pEVar10->typeID = 3;
      pEVar10->source = source;
LAB_00143b2a:
      pEVar10->type = pTVar12;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
      pEVar10->field_0x29 = bVar7;
      return pEVar10;
    }
    pEVar10->typeID = 7;
    pEVar10->source = source;
    pEVar10->type = pTVar12;
LAB_0014345e:
    pEVar10->next = (ExprBase *)0x0;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240518;
    pEVar10[1]._vptr_ExprBase = pp_Var13;
    return pEVar10;
  }
  lhsValue = 0.0;
  rhsValue = 0;
  if (op == SYN_BINARY_OP_LOGICAL_OR) {
    bVar7 = TryTakeLong(lhs,(longlong *)&lhsValue);
    if (!bVar7) {
      return (ExprBase *)0x0;
    }
    if (lhsValue == 4.94065645841247e-324) {
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_01,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      pEVar10->typeID = 3;
      pEVar10->source = source;
      pEVar10->type = pTVar12;
      pEVar10->next = (ExprBase *)0x0;
      *(undefined2 *)&pEVar10->listed = 0x100;
LAB_00142fbc:
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
      return pEVar10;
    }
LAB_00143085:
    pEVar10 = Evaluate(ctx,unevaluatedRhs);
    if ((pEVar10 == (ExprBase *)0x0) || (bVar7 = TryTakeLong(pEVar10,&rhsValue), !bVar7)) {
      return (ExprBase *)0x0;
    }
    pAVar2 = ctx->ctx->allocator;
    iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_03,iVar8);
    pTVar12 = ctx->ctx->typeBool;
    pEVar10->typeID = 3;
    pEVar10->source = source;
LAB_001430d5:
    pEVar10->type = pTVar12;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
    pEVar10->field_0x29 = rhsValue != 0;
    goto LAB_001430ed;
  }
  if (op == SYN_BINARY_OP_LOGICAL_AND) {
    bVar7 = TryTakeLong(lhs,(longlong *)&lhsValue);
    if (!bVar7) {
      return (ExprBase *)0x0;
    }
    if (lhsValue == 0.0) {
      pAVar2 = ctx->ctx->allocator;
      iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      pEVar10->typeID = 3;
      pEVar10->source = source;
      pEVar10->type = pTVar12;
      pEVar10->next = (ExprBase *)0x0;
      *(undefined2 *)&pEVar10->listed = 0;
      goto LAB_00142fbc;
    }
    goto LAB_00143085;
  }
  pEVar10 = Evaluate(ctx,unevaluatedRhs);
  if (pEVar10 == (ExprBase *)0x0) {
    return (ExprBase *)0x0;
  }
  local_38 = source;
  if (lhs->type != pEVar10->type) {
    __assert_fail("lhs->type == rhs->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x28a,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  }
  pEVar3 = ctx->ctx;
  pTVar12 = (&pEVar3->typeInt)[lhs->type == pEVar3->typeLong];
  bVar7 = TryTakeLong(lhs,(longlong *)&lhsValue);
  if ((!bVar7) ||
     (bVar7 = TryTakeLong(pEVar10,&rhsValue), dVar15 = lhsValue, lVar6 = rhsValue, !bVar7))
  goto LAB_0014318e;
  bVar5 = (byte)rhsValue;
  if (pTVar12 == pEVar3->typeInt) {
    if (0x13 < op - SYN_BINARY_OP_ADD) {
switchD_00143223_caseD_12:
      __assert_fail("!\"unexpected type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x2de,
                    "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                   );
    }
    uVar14 = SUB84(lhsValue,0);
    uVar18 = (uint)rhsValue;
    switch(op) {
    case SYN_BINARY_OP_ADD:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_06,iVar8);
      pTVar12 = lhs->type;
      uVar18 = uVar18 + uVar14;
      break;
    case SYN_BINARY_OP_SUB:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_49,iVar8);
      pTVar12 = lhs->type;
      iVar8 = uVar14 - uVar18;
      goto LAB_00143cfa;
    case SYN_BINARY_OP_MUL:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_46,iVar8);
      pTVar12 = lhs->type;
      iVar8 = uVar14 * uVar18;
LAB_00143cfa:
      pp_Var13 = (_func_int **)(long)iVar8;
      goto LAB_00143cfd;
    case SYN_BINARY_OP_DIV:
      if (uVar18 != 0) {
        iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
        pEVar10 = (ExprBase *)CONCAT44(extraout_var_48,iVar8);
        pTVar12 = lhs->type;
        pp_Var13 = (_func_int **)
                   (long)(int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                     (ulong)dVar15 & 0xffffffff) / (long)(int)uVar18);
LAB_00143c80:
        pEVar10->typeID = 6;
        pEVar10->source = local_38;
        pEVar10->type = pTVar12;
        pEVar10->next = (ExprBase *)0x0;
        pEVar10->listed = false;
        pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002404e0;
        pEVar10[1]._vptr_ExprBase = pp_Var13;
        return pEVar10;
      }
      goto LAB_00143cb2;
    case SYN_BINARY_OP_MOD:
      if (uVar18 != 0) {
        iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
        pEVar10 = (ExprBase *)CONCAT44(extraout_var_44,iVar8);
        pTVar12 = lhs->type;
        pp_Var13 = (_func_int **)
                   (long)(int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                     (ulong)dVar15 & 0xffffffff) % (long)(int)uVar18);
        goto LAB_00143c80;
      }
      goto LAB_00143bb0;
    case SYN_BINARY_OP_POW:
      if (-1 < (int)uVar18) {
        iVar8 = 1;
        uVar11 = rhsValue;
        while( true ) {
          iVar9 = SUB84(dVar15,0);
          if ((uint)uVar11 == 0) break;
          iVar4 = 1;
          if ((uVar11 & 1) != 0) {
            iVar4 = iVar9;
          }
          iVar8 = iVar8 * iVar4;
          dVar15 = (double)(ulong)(uint)(iVar9 * iVar9);
          uVar11 = (ulong)((uint)uVar11 >> 1);
        }
        iVar9 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
        pEVar10 = (ExprBase *)CONCAT44(extraout_var_51,iVar9);
        pTVar12 = lhs->type;
        pp_Var13 = (_func_int **)(long)iVar8;
        goto LAB_00143cfd;
      }
      goto LAB_00143c08;
    case SYN_BINARY_OP_SHL:
      if (-1 < (int)uVar18) {
        iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
        pEVar10 = (ExprBase *)CONCAT44(extraout_var_50,iVar8);
        iVar8 = uVar14 << (bVar5 & 0x1f);
LAB_00143cf5:
        pTVar12 = lhs->type;
        goto LAB_00143cfa;
      }
      goto LAB_00143d2f;
    case SYN_BINARY_OP_SHR:
      if (-1 < (int)uVar18) {
        iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
        pEVar10 = (ExprBase *)CONCAT44(extraout_var_47,iVar8);
        iVar8 = (int)uVar14 >> (bVar5 & 0x1f);
        goto LAB_00143cf5;
      }
LAB_00143d2f:
      pcVar16 = "ERROR: negative shift value";
LAB_00143d36:
      ReportCritical(ctx,pcVar16);
      return (ExprBase *)0x0;
    case SYN_BINARY_OP_LESS:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_39,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->typeID = 3;
      pEVar10->source = local_38;
      pEVar10->type = pTVar12;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
      pEVar10->field_0x29 = (int)uVar14 < (int)uVar18;
      return pEVar10;
    case SYN_BINARY_OP_LESS_EQUAL:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_36,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->typeID = 3;
      pEVar10->source = local_38;
      pEVar10->type = pTVar12;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
      pEVar10->field_0x29 = (int)uVar14 <= (int)uVar18;
      return pEVar10;
    case SYN_BINARY_OP_GREATER:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_38,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->typeID = 3;
      pEVar10->source = local_38;
      pEVar10->type = pTVar12;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
      pEVar10->field_0x29 = (int)uVar18 < (int)uVar14;
      return pEVar10;
    case SYN_BINARY_OP_GREATER_EQUAL:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_35,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->typeID = 3;
      pEVar10->source = local_38;
      pEVar10->type = pTVar12;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
      pEVar10->field_0x29 = (int)uVar18 <= (int)uVar14;
      return pEVar10;
    case SYN_BINARY_OP_EQUAL:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_37,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      pEVar10->next = (ExprBase *)0x0;
      bVar7 = uVar14 == uVar18;
      pEVar10->typeID = 3;
      pEVar10->source = local_38;
      goto LAB_00143174;
    case SYN_BINARY_OP_NOT_EQUAL:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_40,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      pEVar10->next = (ExprBase *)0x0;
      bVar7 = uVar14 == uVar18;
      pEVar10->typeID = 3;
      pEVar10->source = local_38;
      goto LAB_001431e5;
    case SYN_BINARY_OP_BIT_AND:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_42,iVar8);
      pTVar12 = lhs->type;
      uVar18 = uVar18 & uVar14;
      break;
    case SYN_BINARY_OP_BIT_OR:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_45,iVar8);
      pTVar12 = lhs->type;
      uVar18 = uVar18 | uVar14;
      break;
    case SYN_BINARY_OP_BIT_XOR:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_43,iVar8);
      pTVar12 = lhs->type;
      uVar18 = uVar18 ^ uVar14;
      break;
    default:
      goto switchD_00143223_caseD_12;
    case SYN_BINARY_OP_LOGICAL_XOR:
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_41,iVar8);
      pTVar12 = ctx->ctx->typeBool;
      bVar7 = uVar14 != 0;
      bVar20 = uVar18 == 0;
      goto LAB_00143b14;
    }
    pp_Var13 = (_func_int **)(long)(int)uVar18;
    goto LAB_00143cfd;
  }
  switch(op) {
  case SYN_BINARY_OP_ADD:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_02,iVar8);
    pTVar12 = lhs->type;
    pp_Var13 = (_func_int **)(rhsValue + (long)lhsValue);
    break;
  case SYN_BINARY_OP_SUB:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_32,iVar8);
    pTVar12 = lhs->type;
    pp_Var13 = (_func_int **)((long)lhsValue - rhsValue);
    break;
  case SYN_BINARY_OP_MUL:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_29,iVar8);
    pTVar12 = lhs->type;
    pp_Var13 = (_func_int **)(rhsValue * (long)lhsValue);
    break;
  case SYN_BINARY_OP_DIV:
    if (rhsValue != 0) {
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_31,iVar8);
      pTVar12 = lhs->type;
      pp_Var13 = (_func_int **)((long)lhsValue / lVar6);
      goto LAB_00143c80;
    }
LAB_00143cb2:
    pcVar16 = "ERROR: division by zero during constant folding";
    goto LAB_00143d36;
  case SYN_BINARY_OP_MOD:
    if (rhsValue != 0) {
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_27,iVar8);
      pTVar12 = lhs->type;
      pp_Var13 = (_func_int **)((long)lhsValue % lVar6);
      pEVar10->typeID = 6;
      pEVar10->source = local_38;
      pEVar10->type = pTVar12;
      goto LAB_001438c6;
    }
LAB_00143bb0:
    pcVar16 = "ERROR: modulus division by zero during constant folding";
    goto LAB_00143d36;
  case SYN_BINARY_OP_POW:
    if (-1 < rhsValue) {
      pp_Var13 = (_func_int **)lhsValue;
      pp_Var19 = (_func_int **)0x1;
      for (uVar11 = rhsValue; uVar11 != 0; uVar11 = uVar11 >> 1) {
        pp_Var17 = (_func_int **)0x1;
        if ((uVar11 & 1) != 0) {
          pp_Var17 = pp_Var13;
        }
        pp_Var19 = (_func_int **)((long)pp_Var19 * (long)pp_Var17);
        pp_Var13 = (_func_int **)((long)pp_Var13 * (long)pp_Var13);
      }
      iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_34,iVar8);
      pTVar12 = lhs->type;
      pEVar10->typeID = 6;
      pEVar10->source = local_38;
      pEVar10->type = pTVar12;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002404e0;
      pEVar10[1]._vptr_ExprBase = pp_Var19;
      return pEVar10;
    }
LAB_00143c08:
    pcVar16 = "ERROR: negative power on integer number in exponentiation during constant folding";
    goto LAB_00143d36;
  case SYN_BINARY_OP_SHL:
    if (rhsValue < 0) goto LAB_00143d2f;
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_33,iVar8);
    pp_Var13 = (_func_int **)((long)lhsValue << (bVar5 & 0x3f));
    goto LAB_001438a9;
  case SYN_BINARY_OP_SHR:
    if (rhsValue < 0) goto LAB_00143d2f;
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_30,iVar8);
    pp_Var13 = (_func_int **)((long)lhsValue >> (bVar5 & 0x3f));
LAB_001438a9:
    pTVar12 = lhs->type;
    pEVar10->typeID = 6;
    pEVar10->source = local_38;
    pEVar10->type = pTVar12;
LAB_001438c6:
    pEVar10->next = (ExprBase *)0x0;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002404e0;
    pEVar10[1]._vptr_ExprBase = pp_Var13;
    return pEVar10;
  case SYN_BINARY_OP_LESS:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_22,iVar8);
    pTVar12 = ctx->ctx->typeBool;
    pEVar10->typeID = 3;
    pEVar10->source = local_38;
    pEVar10->type = pTVar12;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
    pEVar10->field_0x29 = (long)lhsValue < rhsValue;
    goto LAB_001430ed;
  case SYN_BINARY_OP_LESS_EQUAL:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_19,iVar8);
    pTVar12 = ctx->ctx->typeBool;
    pEVar10->typeID = 3;
    pEVar10->source = local_38;
    pEVar10->type = pTVar12;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
    pEVar10->field_0x29 = (long)lhsValue <= rhsValue;
    goto LAB_001430ed;
  case SYN_BINARY_OP_GREATER:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_21,iVar8);
    pTVar12 = ctx->ctx->typeBool;
    pEVar10->typeID = 3;
    pEVar10->source = local_38;
    pEVar10->type = pTVar12;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
    pEVar10->field_0x29 = rhsValue < (long)lhsValue;
    goto LAB_001430ed;
  case SYN_BINARY_OP_GREATER_EQUAL:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_18,iVar8);
    pTVar12 = ctx->ctx->typeBool;
    pEVar10->typeID = 3;
    pEVar10->source = local_38;
    pEVar10->type = pTVar12;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
    pEVar10->field_0x29 = rhsValue <= (long)lhsValue;
    goto LAB_001430ed;
  case SYN_BINARY_OP_EQUAL:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_20,iVar8);
    pTVar12 = ctx->ctx->typeBool;
    pEVar10->typeID = 3;
    pEVar10->source = local_38;
    pEVar10->type = pTVar12;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240470;
    pEVar10->field_0x29 = lhsValue == (double)rhsValue;
LAB_001430ed:
    pEVar10->next = (ExprBase *)0x0;
    return pEVar10;
  case SYN_BINARY_OP_NOT_EQUAL:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_23,iVar8);
    pTVar12 = ctx->ctx->typeBool;
    rhsValue = (long)lhsValue - rhsValue;
    pEVar10->typeID = 3;
    pEVar10->source = local_38;
    goto LAB_001430d5;
  case SYN_BINARY_OP_BIT_AND:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_25,iVar8);
    pTVar12 = lhs->type;
    pp_Var13 = (_func_int **)(rhsValue & (ulong)lhsValue);
    break;
  case SYN_BINARY_OP_BIT_OR:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_28,iVar8);
    pTVar12 = lhs->type;
    pp_Var13 = (_func_int **)(rhsValue | (ulong)lhsValue);
    break;
  case SYN_BINARY_OP_BIT_XOR:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x38);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_26,iVar8);
    pTVar12 = lhs->type;
    pp_Var13 = (_func_int **)(rhsValue ^ (ulong)lhsValue);
    break;
  default:
    __assert_fail("!\"unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x32a,
                  "ExprBase *CreateBinaryOp(ExpressionEvalContext &, SynBase *, ExprBase *, ExprBase *, SynBinaryOpType)"
                 );
  case SYN_BINARY_OP_LOGICAL_XOR:
    iVar8 = (*pEVar3->allocator->_vptr_Allocator[2])(pEVar3->allocator,0x30);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_24,iVar8);
    bVar7 = lhsValue != 0.0;
    pTVar12 = ctx->ctx->typeBool;
    bVar20 = rhsValue == 0;
LAB_00143b14:
    bVar7 = (bool)(!bVar20 ^ bVar7);
    pEVar10->typeID = 3;
    pEVar10->source = local_38;
    goto LAB_00143b2a;
  }
LAB_00143cfd:
  pEVar10->typeID = 6;
  pEVar10->source = local_38;
  pEVar10->type = pTVar12;
  pEVar10->next = (ExprBase *)0x0;
  pEVar10->listed = false;
  pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002404e0;
  pEVar10[1]._vptr_ExprBase = pp_Var13;
  return pEVar10;
}

Assistant:

ExprBase* CreateBinaryOp(ExpressionEvalContext &ctx, SynBase *source, ExprBase *lhs, ExprBase *unevaluatedRhs, SynBinaryOpType op)
{
	if(isType<TypeError>(lhs->type) || isType<TypeError>(unevaluatedRhs->type))
		return Report(ctx, "ERROR: encountered an error node");

	assert(lhs->type == unevaluatedRhs->type);

	if((ctx.ctx.IsIntegerType(lhs->type) || isType<TypeEnum>(lhs->type)) && (ctx.ctx.IsIntegerType(unevaluatedRhs->type) || isType<TypeEnum>(unevaluatedRhs->type)))
	{
		long long lhsValue = 0;
		long long rhsValue = 0;

		// Short-circuit behaviour
		if(op == SYN_BINARY_OP_LOGICAL_AND)
		{
			if(TryTakeLong(lhs, lhsValue))
			{
				if(lhsValue == 0)
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, false);

				ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

				if(!rhs)
					return NULL;

				if(TryTakeLong(rhs, rhsValue))
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, rhsValue != 0);
			}

			return NULL;
		}

		if(op == SYN_BINARY_OP_LOGICAL_OR)
		{
			if(TryTakeLong(lhs, lhsValue))
			{
				if(lhsValue == 1)
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, true);

				ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

				if(!rhs)
					return NULL;

				if(TryTakeLong(rhs, rhsValue))
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, rhsValue != 0);
			}

			return NULL;
		}

		ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

		if(!rhs)
			return NULL;

		assert(lhs->type == rhs->type);

		TypeBase *resultType = ctx.ctx.typeInt;

		if(lhs->type == ctx.ctx.typeLong || rhs->type == ctx.ctx.typeLong)
			resultType = ctx.ctx.typeLong;

		if(TryTakeLong(lhs, lhsValue) && TryTakeLong(rhs, rhsValue))
		{
			if(resultType == ctx.ctx.typeInt)
			{
				int lhsValueInt = int(lhsValue);
				int rhsValueInt = int(rhsValue);

				switch(op)
				{
				case SYN_BINARY_OP_ADD:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt + rhsValueInt);
				case SYN_BINARY_OP_SUB:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt - rhsValueInt);
				case SYN_BINARY_OP_MUL:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, int(lhsValueInt * rhsValueInt));
				case SYN_BINARY_OP_DIV:
					if(rhsValueInt == 0)
						return ReportCritical(ctx, "ERROR: division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt / rhsValueInt);
				case SYN_BINARY_OP_MOD:
					if(rhsValueInt == 0)
						return ReportCritical(ctx, "ERROR: modulus division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt % rhsValueInt);
				case SYN_BINARY_OP_POW:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative power on integer number in exponentiation during constant folding");

					int result, power;

					result = 1;
					power = rhsValueInt;

					while(power)
					{
						if(power & 1)
						{
							result *= lhsValueInt;
							power--;
						}
						lhsValueInt *= lhsValueInt;
						power >>= 1;
					}

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, result);
				case SYN_BINARY_OP_SHL:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt << rhsValueInt);
				case SYN_BINARY_OP_SHR:
					if(rhsValueInt < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt >> rhsValueInt);
				case SYN_BINARY_OP_LESS:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt < rhsValueInt);
				case SYN_BINARY_OP_LESS_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt <= rhsValueInt);
				case SYN_BINARY_OP_GREATER:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt > rhsValueInt);
				case SYN_BINARY_OP_GREATER_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt >= rhsValueInt);
				case SYN_BINARY_OP_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt == rhsValueInt);
				case SYN_BINARY_OP_NOT_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValueInt != rhsValueInt);
				case SYN_BINARY_OP_BIT_AND:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt & rhsValueInt);
				case SYN_BINARY_OP_BIT_OR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt | rhsValueInt);
				case SYN_BINARY_OP_BIT_XOR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValueInt ^ rhsValueInt);
				case SYN_BINARY_OP_LOGICAL_XOR:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, !!lhsValueInt != !!rhsValueInt);
				default:
					assert(!"unexpected type");
					break;
				}
			}
			else
			{
				switch(op)
				{
				case SYN_BINARY_OP_ADD:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue + rhsValue);
				case SYN_BINARY_OP_SUB:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue - rhsValue);
				case SYN_BINARY_OP_MUL:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue * rhsValue);
				case SYN_BINARY_OP_DIV:
					if(rhsValue == 0)
						return ReportCritical(ctx, "ERROR: division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue / rhsValue);
				case SYN_BINARY_OP_MOD:
					if(rhsValue == 0)
						return ReportCritical(ctx, "ERROR: modulus division by zero during constant folding");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue % rhsValue);
				case SYN_BINARY_OP_POW:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative power on integer number in exponentiation during constant folding");

					long long result, power;

					result = 1;
					power = rhsValue;

					while(power)
					{
						if(power & 1)
						{
							result *= lhsValue;
							power--;
						}
						lhsValue *= lhsValue;
						power >>= 1;
					}

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, result);
				case SYN_BINARY_OP_SHL:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue << rhsValue);
				case SYN_BINARY_OP_SHR:
					if(rhsValue < 0)
						return ReportCritical(ctx, "ERROR: negative shift value");

					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue >> rhsValue);
				case SYN_BINARY_OP_LESS:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue < rhsValue);
				case SYN_BINARY_OP_LESS_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue <= rhsValue);
				case SYN_BINARY_OP_GREATER:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue > rhsValue);
				case SYN_BINARY_OP_GREATER_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue >= rhsValue);
				case SYN_BINARY_OP_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);
				case SYN_BINARY_OP_NOT_EQUAL:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
				case SYN_BINARY_OP_BIT_AND:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue & rhsValue);
				case SYN_BINARY_OP_BIT_OR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue | rhsValue);
				case SYN_BINARY_OP_BIT_XOR:
					return new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, lhs->type, lhsValue ^ rhsValue);
				case SYN_BINARY_OP_LOGICAL_XOR:
					return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, !!lhsValue != !!rhsValue);
				default:
					assert(!"unexpected type");
					break;
				}
			}
		}

		return Report(ctx, "ERROR: failed to eval binary op");
	}

	ExprBase *rhs = Evaluate(ctx, unevaluatedRhs);

	if(!rhs)
		return NULL;

	if(ctx.ctx.IsFloatingPointType(lhs->type) && ctx.ctx.IsFloatingPointType(rhs->type))
	{
		assert(lhs->type == rhs->type);

		double lhsValue = 0;
		double rhsValue = 0;

		if(TryTakeDouble(lhs, lhsValue) && TryTakeDouble(rhs, rhsValue))
		{
			switch(op)
			{
			case SYN_BINARY_OP_ADD:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue + rhsValue);
			case SYN_BINARY_OP_SUB:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue - rhsValue);
			case SYN_BINARY_OP_MUL:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue * rhsValue);
			case SYN_BINARY_OP_DIV:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, lhsValue / rhsValue);
			case SYN_BINARY_OP_MOD:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, fmod(lhsValue, rhsValue));
			case SYN_BINARY_OP_POW:
				return new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(source, lhs->type, pow(lhsValue, rhsValue));
			case SYN_BINARY_OP_LESS:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue < rhsValue);
			case SYN_BINARY_OP_LESS_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue <= rhsValue);
			case SYN_BINARY_OP_GREATER:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue > rhsValue);
			case SYN_BINARY_OP_GREATER_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue >= rhsValue);
			case SYN_BINARY_OP_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);
			case SYN_BINARY_OP_NOT_EQUAL:
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
			default:
				assert(!"unexpected type");
				break;
			}
		}
	}
	else if(lhs->type == ctx.ctx.typeTypeID && rhs->type == ctx.ctx.typeTypeID)
	{
		TypeBase *lhsValue = NULL;
		TypeBase *rhsValue = NULL;

		if(TryTakeTypeId(lhs, lhsValue) && TryTakeTypeId(rhs, rhsValue))
		{
			if(op == SYN_BINARY_OP_EQUAL)
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue == rhsValue);

			if(op == SYN_BINARY_OP_NOT_EQUAL)
				return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lhsValue != rhsValue);
		}
	}
	else if(isType<TypeRef>(lhs->type) && isType<TypeRef>(rhs->type))
	{
		assert(lhs->type == rhs->type);

		void *lPtr = NULL;

		if(isType<ExprNullptrLiteral>(lhs))
			lPtr = NULL;
		else if(ExprPointerLiteral *value = getType<ExprPointerLiteral>(lhs))
			lPtr = value->ptr;
		else
			assert(!"unknown type");

		void *rPtr = NULL;

		if(isType<ExprNullptrLiteral>(rhs))
			rPtr = NULL;
		else if(ExprPointerLiteral *value = getType<ExprPointerLiteral>(rhs))
			rPtr = value->ptr;
		else
			assert(!"unknown type");

		if(op == SYN_BINARY_OP_EQUAL)
			return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lPtr == rPtr);

		if(op == SYN_BINARY_OP_NOT_EQUAL)
			return new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.ctx.typeBool, lPtr != rPtr);
	}

	return Report(ctx, "ERROR: failed to eval binary op");
}